

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

bool __thiscall
glslang::HlslParseContext::setTextureReturnType
          (HlslParseContext *this,TSampler *sampler,TType *retType,TSourceLoc *loc)

{
  pointer pTVar1;
  pointer ppTVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  TTypeList *in_RAX;
  pointer pTVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  _func_int **pp_Var12;
  ulong uVar13;
  TTypeList *members;
  TTypeList *local_38;
  
  sampler->field_0x3 = sampler->field_0x3 | 0x1e;
  local_38 = in_RAX;
  iVar4 = (*retType->_vptr_TType[0x1d])(retType);
  if ((char)iVar4 == '\0') {
    iVar4 = (*retType->_vptr_TType[0x1b])(retType);
    if (((char)iVar4 != '\0') ||
       (iVar4 = (*retType->_vptr_TType[0x18])(retType), (char)iVar4 != '\0')) {
      uVar5 = (*retType->_vptr_TType[0xc])(retType);
      *sampler = (TSampler)((uint)*sampler & 0xfe3fffff | (uVar5 & 7) << 0x16);
      return true;
    }
    iVar4 = (*retType->_vptr_TType[0x25])(retType);
    if ((char)iVar4 == '\0') {
      pp_Var12 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar9 = "Invalid texture template type";
    }
    else if (sampler->field_0x1 == '\a') {
      pp_Var12 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar9 = "Unimplemented: structure template type in subpass input";
    }
    else {
      iVar4 = (*retType->_vptr_TType[0x25])(retType);
      if ((char)iVar4 == '\0') {
        __assert_fail("isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x9e1,"TTypeList *glslang::TType::getWritableStruct() const");
      }
      local_38 = (retType->field_13).structure;
      pTVar7 = (local_38->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pTVar1 = (local_38->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)pTVar7 - (long)pTVar1) < 0x81 && pTVar7 != pTVar1) {
        pTVar7 = (local_38->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((local_38->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>)
            .super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data._M_finish != pTVar7) {
          uVar5 = 0;
          uVar8 = 0;
          uVar13 = 1;
          do {
            iVar4 = (*(pTVar7[uVar8].type)->_vptr_TType[0x18])();
            if (((char)iVar4 == '\0') &&
               (iVar4 = (*((local_38->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ).
                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar8].type)->_vptr_TType[0x1b]
                        )(), (char)iVar4 == '\0')) {
              pp_Var12 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
              pcVar9 = "Invalid texture template struct member type";
              goto LAB_00399237;
            }
            iVar4 = (*((local_38->
                       super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>)
                       .
                       super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar8].type)->_vptr_TType[0xc])();
            uVar5 = uVar5 + iVar4;
            if (4 < uVar5) {
              pp_Var12 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
              pcVar9 = "Too many components in texture template structure type";
              goto LAB_00399237;
            }
            iVar4 = (*((local_38->
                       super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>)
                       .
                       super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar8].type)->_vptr_TType[7])();
            iVar6 = (*((local_38->
                       super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>)
                       .
                       super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                       ._M_impl.super__Vector_impl_data._M_start)->type->_vptr_TType[7])();
            if (iVar4 != iVar6) {
              pp_Var12 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
              pcVar9 = "Texture template structure members must same basic type";
              goto LAB_00399237;
            }
            pTVar7 = (local_38->
                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            bVar3 = uVar13 < (ulong)((long)(local_38->
                                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                           ).
                                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7
                                    >> 5);
            uVar8 = uVar13;
            uVar13 = (ulong)((int)uVar13 + 1);
          } while (bVar3);
        }
        ppTVar2 = (this->textureReturnStruct).
                  super_vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                  .
                  super__Vector_base<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = (long)(this->textureReturnStruct).
                       super_vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                       .
                       super__Vector_base<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2;
        if (lVar10 != 0) {
          uVar5 = 0;
          uVar11 = 1;
          uVar8 = 0;
          do {
            if (ppTVar2[uVar8] == local_38) {
              *sampler = (TSampler)((uint)*sampler & 0xe1ffffff | uVar5 & 0x1e000000);
              return true;
            }
            uVar8 = (ulong)uVar11;
            uVar5 = uVar5 + 0x2000000;
            uVar11 = uVar11 + 1;
          } while (uVar8 < (ulong)(lVar10 >> 3));
        }
        uVar8 = (long)(this->textureReturnStruct).
                      super_vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                      .
                      super__Vector_base<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->textureReturnStruct).
                      super_vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                      .
                      super__Vector_base<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3;
        if (uVar8 < 0xf) {
          *sampler = (TSampler)((uint)*sampler & 0xe1ffffff | (int)uVar8 << 0x19);
          std::
          vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
          ::push_back(&(this->textureReturnStruct).
                       super_vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                      ,&local_38);
          return true;
        }
        pp_Var12 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar9 = "Texture template struct return slots exceeded";
      }
      else {
        pp_Var12 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar9 = "Invalid member count in texture template structure";
      }
    }
  }
  else {
    pp_Var12 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar9 = "Arrays not supported in texture template types";
  }
LAB_00399237:
  (*pp_Var12[0x2d])(this,loc,pcVar9,"","");
  return false;
}

Assistant:

bool HlslParseContext::setTextureReturnType(TSampler& sampler, const TType& retType, const TSourceLoc& loc)
{
    // Seed the output with an invalid index.  We will set it to a valid one if we can.
    sampler.structReturnIndex = TSampler::noReturnStruct;

    // Arrays aren't supported.
    if (retType.isArray()) {
        error(loc, "Arrays not supported in texture template types", "", "");
        return false;
    }

    // If return type is a vector, remember the vector size in the sampler, and return.
    if (retType.isVector() || retType.isScalar()) {
        sampler.vectorSize = retType.getVectorSize();
        return true;
    }

    // If it wasn't a vector, it must be a struct meeting certain requirements.  The requirements
    // are checked below: just check for struct-ness here.
    if (!retType.isStruct()) {
        error(loc, "Invalid texture template type", "", "");
        return false;
    }

    // TODO: Subpass doesn't handle struct returns, due to some oddities with fn overloading.
    if (sampler.isSubpass()) {
        error(loc, "Unimplemented: structure template type in subpass input", "", "");
        return false;
    }

    TTypeList* members = retType.getWritableStruct();

    // Check for too many or not enough structure members.
    if (members->size() > 4 || members->size() == 0) {
        error(loc, "Invalid member count in texture template structure", "", "");
        return false;
    }

    // Error checking: We must have <= 4 total components, all of the same basic type.
    unsigned totalComponents = 0;
    for (unsigned m = 0; m < members->size(); ++m) {
        // Check for bad member types
        if (!(*members)[m].type->isScalar() && !(*members)[m].type->isVector()) {
            error(loc, "Invalid texture template struct member type", "", "");
            return false;
        }

        const unsigned memberVectorSize = (*members)[m].type->getVectorSize();
        totalComponents += memberVectorSize;

        // too many total member components
        if (totalComponents > 4) {
            error(loc, "Too many components in texture template structure type", "", "");
            return false;
        }

        // All members must be of a common basic type
        if ((*members)[m].type->getBasicType() != (*members)[0].type->getBasicType()) {
            error(loc, "Texture template structure members must same basic type", "", "");
            return false;
        }
    }

    // If the structure in the return type already exists in the table, we'll use it.  Otherwise, we'll make
    // a new entry.  This is a linear search, but it hardly ever happens, and the list cannot be very large.
    for (unsigned int idx = 0; idx < textureReturnStruct.size(); ++idx) {
        if (textureReturnStruct[idx] == members) {
            sampler.structReturnIndex = idx;
            return true;
        }
    }

    // It wasn't found as an existing entry.  See if we have room for a new one.
    if (textureReturnStruct.size() >= TSampler::structReturnSlots) {
        error(loc, "Texture template struct return slots exceeded", "", "");
        return false;
    }

    // Insert it in the vector that tracks struct return types.
    sampler.structReturnIndex = unsigned(textureReturnStruct.size());
    textureReturnStruct.push_back(members);

    // Success!
    return true;
}